

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m256v_lu.c
# Opt level: O2

_Bool test_lu_mul_x(_Bool inplace,int n_row,int n_col,int N,int field)

{
  size_t sVar1;
  size_t __n;
  long lVar2;
  long lVar3;
  uint8_t mask;
  int iVar4;
  int n_row_00;
  ulong uVar5;
  uint8_t *memory;
  m256v *M;
  m256v *M_00;
  uint uVar6;
  ulong uVar7;
  uint N_00;
  undefined7 in_register_00000039;
  ulong uVar8;
  ulong uVar9;
  uint8_t *m;
  uint8_t *puVar10;
  int *inverted_out;
  int *rp;
  uint8_t *m_00;
  int *cp;
  uint8_t auStack_170 [8];
  ulong uStack_168;
  size_t sStack_160;
  int aiStack_158 [2];
  undefined1 local_150 [8];
  m256v Y1;
  m256v Y2;
  m256v X;
  m256v A;
  m256v Xi;
  m256v LU;
  
  mask = get_mask(N);
  N_00 = n_col * n_row;
  n_row_00 = n_col;
  if (n_col < n_row) {
    n_row_00 = n_row;
  }
  if ((int)CONCAT71(in_register_00000039,inplace) == 0) {
    n_row_00 = n_col;
  }
  uVar7 = 0;
  uVar8 = (ulong)N_00 + 0xf & 0xfffffffffffffff0;
  uVar9 = (ulong)(uint)(n_row * 8) + 0xf & 0xfffffffffffffff0;
  uVar5 = (ulong)(uint)n_row * 4 + 0xf & 0xfffffffffffffff0;
  do {
    uVar6 = (uint)uVar7;
    if (uVar6 == 10000) {
LAB_00101c90:
      return 9999 < uVar6;
    }
    lVar2 = -uVar8;
    m_00 = (uint8_t *)((long)aiStack_158 + lVar2);
    *(undefined8 *)((long)&sStack_160 + lVar2) = 0x1019e7;
    rand_coeffs(m_00,N_00,mask);
    *(undefined8 *)((long)&sStack_160 + lVar2) = 0x1019fd;
    m256v_make((m256v *)&X.e,n_row,n_col,m_00);
    lVar2 = -((ulong)(uint)(n_row_00 * 8) + 0xf & 0xfffffffffffffff0);
    m = m_00 + lVar2;
    builtin_memcpy(m_00 + lVar2 + -8,"\x1b\x1a\x10",4);
    m[-4] = '\0';
    m[-3] = '\0';
    m[-2] = '\0';
    m[-1] = '\0';
    rand_coeffs(m,n_row_00 * 8,mask);
    builtin_memcpy(m_00 + lVar2 + -8,"0\x1a\x10",4);
    m[-4] = '\0';
    m[-3] = '\0';
    m[-2] = '\0';
    m[-1] = '\0';
    m256v_make((m256v *)&A.e,n_row_00,8,m);
    builtin_memcpy(m_00 + lVar2 + -8,"O\x1a\x10",4);
    m[-4] = '\0';
    m[-3] = '\0';
    m[-2] = '\0';
    m[-1] = '\0';
    m256v_make((m256v *)&Y2.e,n_col,8,m);
    lVar3 = -uVar9;
    memory = m + lVar3;
    builtin_memcpy(m_00 + lVar3 + lVar2 + -8,"y\x1a\x10",4);
    memory[-4] = '\0';
    memory[-3] = '\0';
    memory[-2] = '\0';
    memory[-1] = '\0';
    m256v_make((m256v *)local_150,n_row,8,memory);
    memory[-8] = 0x8b;
    memory[-7] = '\x1a';
    memory[-6] = '\x10';
    memory[-5] = '\0';
    memory[-4] = '\0';
    memory[-3] = '\0';
    memory[-2] = '\0';
    memory[-1] = '\0';
    m256v_mul((m256v *)&X.e,(m256v *)&Y2.e,(m256v *)local_150);
    puVar10 = memory + -uVar8;
    puVar10[-8] = 0xad;
    puVar10[-7] = '\x1a';
    puVar10[-6] = '\x10';
    puVar10[-5] = '\0';
    puVar10[-4] = '\0';
    puVar10[-3] = '\0';
    puVar10[-2] = '\0';
    puVar10[-1] = '\0';
    m256v_make((m256v *)&Xi.e,n_row,n_col,puVar10);
    puVar10[-8] = 0xbc;
    puVar10[-7] = '\x1a';
    puVar10[-6] = '\x10';
    puVar10[-5] = '\0';
    puVar10[-4] = '\0';
    puVar10[-3] = '\0';
    puVar10[-2] = '\0';
    puVar10[-1] = '\0';
    memcpy(puVar10,m_00,(ulong)N_00);
    rp = (int *)(puVar10 + -uVar5);
    cp = (int *)((long)rp - ((ulong)(uint)n_col * 4 + 0xf & 0xfffffffffffffff0));
    cp[-2] = 0x101ae1;
    cp[-1] = 0;
    m256v_LU_decomp_inplace((m256v *)&Xi.e,rp,cp);
    puVar10 = (uint8_t *)((long)cp - uVar9);
    if (inplace) {
      inverted_out = (int *)(puVar10 + -uVar5);
      inverted_out[-2] = 0x101b11;
      inverted_out[-1] = 0;
      perm_invert(n_row,rp,inverted_out);
      inverted_out[-2] = 0x101b2b;
      inverted_out[-1] = 0;
      m256v_LU_mult_inplace((m256v *)&Xi.e,inverted_out,cp,(m256v *)&A.e);
    }
    else {
      puVar10[-8] = '\b';
      puVar10[-7] = '\0';
      puVar10[-6] = '\0';
      puVar10[-5] = '\0';
      puVar10[-4] = '\0';
      puVar10[-3] = '\0';
      puVar10[-2] = '\0';
      puVar10[-1] = '\0';
      builtin_memcpy(puVar10 + -8,"T\x1b\x10",4);
      puVar10[-4] = '\0';
      puVar10[-3] = '\0';
      puVar10[-2] = '\0';
      puVar10[-1] = '\0';
      m256v_make((m256v *)&Y1.e,n_row,(int)*(undefined8 *)(puVar10 + -8),puVar10);
      builtin_memcpy(puVar10 + -8,"p\x1b\x10",4);
      puVar10[-4] = '\0';
      puVar10[-3] = '\0';
      puVar10[-2] = '\0';
      puVar10[-1] = '\0';
      m256v_LU_mult((m256v *)&Xi.e,rp,cp,(m256v *)&Y2.e,(m256v *)&Y1.e);
      m = puVar10;
    }
    puVar10[-8] = 0x86;
    puVar10[-7] = '\x1b';
    puVar10[-6] = '\x10';
    puVar10[-5] = '\0';
    puVar10[-4] = '\0';
    puVar10[-3] = '\0';
    puVar10[-2] = '\0';
    puVar10[-1] = '\0';
    iVar4 = bcmp(memory,m,(ulong)(uint)(n_row * 8));
    if (iVar4 != 0) {
      *(ulong *)(puVar10 + -0x10) = uVar7;
      puVar10[-0x18] = 0xd7;
      puVar10[-0x17] = '\x1b';
      puVar10[-0x16] = '\x10';
      puVar10[-0x15] = '\0';
      puVar10[-0x14] = '\0';
      puVar10[-0x13] = '\0';
      puVar10[-0x12] = '\0';
      puVar10[-0x11] = '\0';
      fprintf(_stderr,"Error:  A*X != PLUQ*X. (inplace=%d, n_row=%d, n_col=%d, field=%d, it=%d)\n",
              (ulong)inplace,(ulong)(uint)n_row,(ulong)(uint)n_col,(ulong)(uint)N);
      puVar10[-8] = '%';
      puVar10[-7] = '\0';
      puVar10[-6] = '\0';
      puVar10[-5] = '\0';
      puVar10[-4] = '\0';
      puVar10[-3] = '\0';
      puVar10[-2] = '\0';
      puVar10[-1] = '\0';
      sVar1 = *(size_t *)(puVar10 + -8);
      puVar10[-8] = '\x01';
      puVar10[-7] = '\0';
      puVar10[-6] = '\0';
      puVar10[-5] = '\0';
      puVar10[-4] = '\0';
      puVar10[-3] = '\0';
      puVar10[-2] = '\0';
      puVar10[-1] = '\0';
      __n = *(size_t *)(puVar10 + -8);
      puVar10[-8] = 0xf2;
      puVar10[-7] = '\x1b';
      puVar10[-6] = '\x10';
      puVar10[-5] = '\0';
      puVar10[-4] = '\0';
      puVar10[-3] = '\0';
      puVar10[-2] = '\0';
      puVar10[-1] = '\0';
      fwrite("        Details about the test case:\n",sVar1,__n,_stderr);
      puVar10[-8] = '\r';
      puVar10[-7] = '\0';
      puVar10[-6] = '\0';
      puVar10[-5] = '\0';
      puVar10[-4] = '\0';
      puVar10[-3] = '\0';
      puVar10[-2] = '\0';
      puVar10[-1] = '\0';
      sVar1 = *(size_t *)(puVar10 + -8);
      puVar10[-8] = '\b';
      puVar10[-7] = '\x1c';
      puVar10[-6] = '\x10';
      puVar10[-5] = '\0';
      puVar10[-4] = '\0';
      puVar10[-3] = '\0';
      puVar10[-2] = '\0';
      puVar10[-1] = '\0';
      fwrite("        rp = ",sVar1,__n,_stderr);
      puVar10[-8] = '\x17';
      puVar10[-7] = '\x1c';
      puVar10[-6] = '\x10';
      puVar10[-5] = '\0';
      puVar10[-4] = '\0';
      puVar10[-3] = '\0';
      puVar10[-2] = '\0';
      puVar10[-1] = '\0';
      print_int_arr((FILE *)_stderr,n_row,rp);
      puVar10[-8] = '\r';
      puVar10[-7] = '\0';
      puVar10[-6] = '\0';
      puVar10[-5] = '\0';
      puVar10[-4] = '\0';
      puVar10[-3] = '\0';
      puVar10[-2] = '\0';
      puVar10[-1] = '\0';
      sVar1 = *(size_t *)(puVar10 + -8);
      puVar10[-8] = '-';
      puVar10[-7] = '\x1c';
      puVar10[-6] = '\x10';
      puVar10[-5] = '\0';
      puVar10[-4] = '\0';
      puVar10[-3] = '\0';
      puVar10[-2] = '\0';
      puVar10[-1] = '\0';
      fwrite("        cp = ",sVar1,__n,_stderr);
      puVar10[-8] = '<';
      puVar10[-7] = '\x1c';
      puVar10[-6] = '\x10';
      puVar10[-5] = '\0';
      puVar10[-4] = '\0';
      puVar10[-3] = '\0';
      puVar10[-2] = '\0';
      puVar10[-1] = '\0';
      print_int_arr((FILE *)_stderr,n_col,cp);
      puVar10[-8] = '\x12';
      puVar10[-7] = '\0';
      puVar10[-6] = '\0';
      puVar10[-5] = '\0';
      puVar10[-4] = '\0';
      puVar10[-3] = '\0';
      puVar10[-2] = '\0';
      puVar10[-1] = '\0';
      sVar1 = *(size_t *)(puVar10 + -8);
      puVar10[-8] = 'R';
      puVar10[-7] = '\x1c';
      puVar10[-6] = '\x10';
      puVar10[-5] = '\0';
      puVar10[-4] = '\0';
      puVar10[-3] = '\0';
      puVar10[-2] = '\0';
      puVar10[-1] = '\0';
      fwrite("        matrix A:\n",sVar1,__n,_stderr);
      puVar10[-8] = 'b';
      puVar10[-7] = '\x1c';
      puVar10[-6] = '\x10';
      puVar10[-5] = '\0';
      puVar10[-4] = '\0';
      puVar10[-3] = '\0';
      puVar10[-2] = '\0';
      puVar10[-1] = '\0';
      print_mat((FILE *)_stderr,(char *)&X.e,M);
      puVar10[-8] = '\x13';
      puVar10[-7] = '\0';
      puVar10[-6] = '\0';
      puVar10[-5] = '\0';
      puVar10[-4] = '\0';
      puVar10[-3] = '\0';
      puVar10[-2] = '\0';
      puVar10[-1] = '\0';
      sVar1 = *(size_t *)(puVar10 + -8);
      puVar10[-8] = 'x';
      puVar10[-7] = '\x1c';
      puVar10[-6] = '\x10';
      puVar10[-5] = '\0';
      puVar10[-4] = '\0';
      puVar10[-3] = '\0';
      puVar10[-2] = '\0';
      puVar10[-1] = '\0';
      fwrite("        matrix LU:\n",sVar1,__n,_stderr);
      puVar10[-8] = 0x88;
      puVar10[-7] = '\x1c';
      puVar10[-6] = '\x10';
      puVar10[-5] = '\0';
      puVar10[-4] = '\0';
      puVar10[-3] = '\0';
      puVar10[-2] = '\0';
      puVar10[-1] = '\0';
      print_mat((FILE *)_stderr,(char *)&Xi.e,M_00);
      goto LAB_00101c90;
    }
    uVar7 = (ulong)(uVar6 + 1);
  } while( true );
}

Assistant:

static bool test_lu_mul_x(bool inplace, int n_row, int n_col, int N, int field)
{
	const uint8_t mask = get_mask(field);
	const int dlen = 8;

	for (int i = 0; i < N; ++i) {
		/* Create a random matrix */
		Def_mat256_rand(A, a, n_row, n_col, mask)
		Def_mat256_rand(Xi, x,
			(inplace && n_row > n_col) ? n_row : n_col,
			dlen, mask)
		m256v X = m256v_make(n_col, dlen, x);

		/* Compute A*X the direct way */
		m256v_Def(Y1, y1, n_row, dlen)
		m256v_mul(&A, &X, &Y1);

		/* Copy A -> LU */
		m256v_Def(LU, lu, n_row, n_col)
		memcpy(lu, a, sizeof(lu));

		/* Calculate LU decomposition */
		int rp[n_row], cp[n_col];
		m256v_LU_decomp_inplace(&LU, rp, cp);

		/* Compute A*X via LU decomposition */
		uint8_t y2_back[n_row * dlen];
		uint8_t* y2;
		if (!inplace) {
			/* non-inplace.  Test m256v_LU_mult */
			m256v Y2 = m256v_make(n_row, dlen, y2_back);
			m256v_LU_mult(&LU, rp, cp, &X, &Y2);

			y2 = y2_back;
		} else {
			/* inplace.  Test m256v_LU_mult_inplace */
			int inv_rp[n_row];
			perm_invert(n_row, rp, inv_rp);
			m256v_LU_mult_inplace(&LU,
						inv_rp,
						cp,
						&Xi);

			y2 = x;
		}

		/* Compare */
		if (memcmp(y1, y2, sizeof(y1)) != 0) {
			fprintf(stderr, "Error:  A*X != PLUQ*X. "
			  "(inplace=%d, n_row=%d, n_col=%d, field=%d, it=%d)\n",
			  inplace, n_row, n_col, field, i);

			/* Print details on the test case */
			fprintf(stderr, "        Details about the "
			  "test case:\n");
			fprintf(stderr, "        rp = ");
			print_int_arr(stderr, n_row, rp);
			fprintf(stderr, "        cp = ");
			print_int_arr(stderr, n_col, cp);
			fprintf(stderr, "        matrix A:\n");
			print_mat(stderr, "        ", &A);
			fprintf(stderr, "        matrix LU:\n");
			print_mat(stderr, "        ", &LU);
			return false;
		}

	}
	return true;
}